

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidexample.cpp
# Opt level: O1

void drawBlob(vector<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
              *image,int width,int height,float x,float y,float z,int size,int color,uint32_t *ids)

{
  vector<Rgbaz,std::allocator<Rgbaz>> *pvVar1;
  pointer pvVar2;
  iterator __position;
  char cVar3;
  undefined4 __x;
  int iVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Rgbaz local_78;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  fVar7 = ABS(z);
  local_78.z._h = (ushort)((uint)z >> 0x10) & 0x8000;
  if ((uint)fVar7 < 0x38800000) {
    if ((0x33000000 < (uint)fVar7) &&
       (uVar5 = (uint)z & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
       local_78.z._h = local_78.z._h | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
       0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
      local_78.z._h = local_78.z._h + 1;
    }
  }
  else if ((uint)fVar7 < 0x7f800000) {
    if ((uint)fVar7 < 0x477ff000) {
      local_78.z._h =
           (ushort)((int)fVar7 + 0x8000fffU + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd) |
           local_78.z._h;
    }
    else {
      local_78.z._h = local_78.z._h | 0x7c00;
    }
  }
  else {
    local_78.z._h = local_78.z._h | 0x7c00;
    if (fVar7 != INFINITY) {
      uVar5 = (uint)fVar7 >> 0xd & 0x3ff;
      local_78.z._h = local_78.z._h | (ushort)uVar5 | (ushort)(uVar5 == 0);
    }
  }
  local_78.id0 = (uint32_t)*(undefined8 *)ids;
  local_78.id1 = (uint32_t)((ulong)*(undefined8 *)ids >> 0x20);
  local_78.id2 = (uint32_t)*(undefined8 *)(ids + 2);
  local_78.id3 = (uint32_t)((ulong)*(undefined8 *)(ids + 2) >> 0x20);
  local_78.id4 = ids[4];
  if (0 < height) {
    fVar7 = (float)(size * 0x28 + 5);
    iVar4 = 0;
    iVar8 = 0;
    do {
      if (0 < width) {
        lVar6 = (long)iVar4 * 0x18;
        iVar9 = 0;
        do {
          local_48 = (x - (float)iVar9) * (x - (float)iVar9) +
                     ((float)iVar8 - y) * ((float)iVar8 - y);
          local_58 = ZEXT416((uint)local_48);
          local_48 = -local_48;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          fVar10 = expf(local_48 / fVar7);
          __x = local_58._0_4_;
          if ((float)local_58._0_4_ < local_48) {
            local_58._0_4_ = fVar10;
            fVar11 = sqrtf((float)__x);
            fVar10 = (float)local_58._0_4_;
          }
          else {
            fVar11 = SQRT((float)local_58._0_4_);
          }
          fVar10 = fVar10 * (1.0 - fVar11 / fVar7);
          if (0.001 < fVar10) {
            fVar12 = *(float *)(_imath_half_to_float_table + (ulong)colors[color].r._h * 4) * fVar10
            ;
            fVar11 = ABS(fVar12);
            local_78.r._h = (ushort)((uint)fVar12 >> 0x10) & 0x8000;
            if ((uint)fVar11 < 0x38800000) {
              if ((0x33000000 < (uint)fVar11) &&
                 (uVar5 = (uint)fVar11 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar11 >> 0x17),
                 local_78.r._h = local_78.r._h | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
                 0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
                local_78.r._h = local_78.r._h + 1;
              }
            }
            else if ((uint)fVar11 < 0x7f800000) {
              if ((uint)fVar11 < 0x477ff000) {
                local_78.r._h =
                     (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >>
                             0xd) | local_78.r._h;
              }
              else {
                local_78.r._h = local_78.r._h | 0x7c00;
              }
            }
            else {
              local_78.r._h = local_78.r._h | 0x7c00;
              if (fVar11 != INFINITY) {
                uVar5 = (uint)fVar11 >> 0xd & 0x3ff;
                local_78.r._h = local_78.r._h | (ushort)uVar5 | (ushort)(uVar5 == 0);
              }
            }
            fVar12 = *(float *)(_imath_half_to_float_table + (ulong)colors[color].g._h * 4) * fVar10
            ;
            fVar11 = ABS(fVar12);
            local_78.g._h = (ushort)((uint)fVar12 >> 0x10) & 0x8000;
            if ((uint)fVar11 < 0x38800000) {
              if ((0x33000000 < (uint)fVar11) &&
                 (uVar5 = (uint)fVar11 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar11 >> 0x17),
                 local_78.g._h = local_78.g._h | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
                 0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
                local_78.g._h = local_78.g._h + 1;
              }
            }
            else if ((uint)fVar11 < 0x7f800000) {
              if ((uint)fVar11 < 0x477ff000) {
                local_78.g._h =
                     (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >>
                             0xd) | local_78.g._h;
              }
              else {
                local_78.g._h = local_78.g._h | 0x7c00;
              }
            }
            else {
              local_78.g._h = local_78.g._h | 0x7c00;
              if (fVar11 != INFINITY) {
                uVar5 = (uint)fVar11 >> 0xd & 0x3ff;
                local_78.g._h = local_78.g._h | (ushort)uVar5 | (ushort)(uVar5 == 0);
              }
            }
            fVar12 = *(float *)(_imath_half_to_float_table + (ulong)colors[color].b._h * 4) * fVar10
            ;
            fVar11 = ABS(fVar12);
            local_78.b._h = (ushort)((uint)fVar12 >> 0x10) & 0x8000;
            if ((uint)fVar11 < 0x38800000) {
              if ((0x33000000 < (uint)fVar11) &&
                 (uVar5 = (uint)fVar11 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar11 >> 0x17),
                 local_78.b._h = local_78.b._h | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
                 0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
                local_78.b._h = local_78.b._h + 1;
              }
            }
            else if ((uint)fVar11 < 0x7f800000) {
              if ((uint)fVar11 < 0x477ff000) {
                local_78.b._h =
                     (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >>
                             0xd) | local_78.b._h;
              }
              else {
                local_78.b._h = local_78.b._h | 0x7c00;
              }
            }
            else {
              local_78.b._h = local_78.b._h | 0x7c00;
              if (fVar11 != INFINITY) {
                uVar5 = (uint)fVar11 >> 0xd & 0x3ff;
                local_78.b._h = local_78.b._h | (ushort)uVar5 | (ushort)(uVar5 == 0);
              }
            }
            fVar11 = ABS(fVar10);
            local_78.a._h = (ushort)((uint)fVar10 >> 0x10) & 0x8000;
            if ((uint)fVar11 < 0x38800000) {
              if ((0x33000000 < (uint)fVar11) &&
                 (uVar5 = (uint)fVar11 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar11 >> 0x17),
                 local_78.a._h = local_78.a._h | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
                 0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
                local_78.a._h = local_78.a._h + 1;
              }
            }
            else if ((uint)fVar11 < 0x7f800000) {
              if ((uint)fVar11 < 0x477ff000) {
                local_78.a._h =
                     (ushort)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >>
                             0xd) | local_78.a._h;
              }
              else {
                local_78.a._h = local_78.a._h | 0x7c00;
              }
            }
            else {
              local_78.a._h = local_78.a._h | 0x7c00;
              if (fVar11 != INFINITY) {
                uVar5 = (uint)fVar11 >> 0xd & 0x3ff;
                local_78.a._h = local_78.a._h | (ushort)uVar5 | (ushort)(uVar5 == 0);
              }
            }
            pvVar2 = (image->
                     super__Vector_base<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pvVar1 = (vector<Rgbaz,std::allocator<Rgbaz>> *)
                     ((long)&(pvVar2->super__Vector_base<Rgbaz,_std::allocator<Rgbaz>_>)._M_impl.
                             super__Vector_impl_data + lVar6);
            __position._M_current =
                 *(Rgbaz **)
                  ((long)&(pvVar2->super__Vector_base<Rgbaz,_std::allocator<Rgbaz>_>)._M_impl.
                          super__Vector_impl_data + lVar6 + 8);
            if (__position._M_current ==
                *(Rgbaz **)
                 ((long)&(pvVar2->super__Vector_base<Rgbaz,_std::allocator<Rgbaz>_>)._M_impl.
                         super__Vector_impl_data + lVar6 + 0x10)) {
              std::vector<Rgbaz,std::allocator<Rgbaz>>::_M_realloc_insert<Rgbaz_const&>
                        (pvVar1,__position,&local_78);
            }
            else {
              (__position._M_current)->id1 = local_78.id1;
              (__position._M_current)->id2 = local_78.id2;
              (__position._M_current)->id3 = local_78.id3;
              (__position._M_current)->id4 = local_78.id4;
              (__position._M_current)->r = (half)local_78.r._h;
              (__position._M_current)->g = (half)local_78.g._h;
              (__position._M_current)->b = (half)local_78.b._h;
              (__position._M_current)->a = (half)local_78.a._h;
              (__position._M_current)->z = (half)local_78.z._h;
              *(undefined2 *)&(__position._M_current)->field_0xa = local_78._10_2_;
              (__position._M_current)->id0 = local_78.id0;
              pvVar1 = pvVar1 + 8;
              *(long *)pvVar1 = *(long *)pvVar1 + 0x20;
            }
          }
          iVar9 = iVar9 + 1;
          lVar6 = lVar6 + 0x18;
        } while (width != iVar9);
        iVar4 = iVar4 + iVar9;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != height);
  }
  return;
}

Assistant:

void
drawBlob (
    std::vector<std::vector<Rgbaz>>& image,
    int                              width,
    int                              height,
    float                            x,
    float                            y,
    float                            z,
    int                              size,
    int                              color,
    const uint32_t*                  ids)
{
    //
    // draw windowed gaussian centered at (x,y)
    //

    float sigma = 5 + 40 * size;

    int ptr = 0;

    Rgbaz point;
    point.z   = z;
    point.id0 = ids[0];
    point.id1 = ids[1];
    point.id2 = ids[2];
    point.id3 = ids[3];
    point.id4 = ids[4];

    for (int j = 0; j < height; ++j)
    {
        for (int i = 0; i < width; ++i)
        {
            float dist_sq = (x - i) * (x - i) + (j - y) * (j - y);
            float scale =
                exp (-dist_sq / sigma) * (1.f - sqrt (dist_sq) / sigma);

            if (scale > 0.001)
            {
                point.r = colors[color].r * scale;
                point.g = colors[color].g * scale;
                point.b = colors[color].b * scale;
                point.a = scale;

                image[ptr].push_back (point);
            }

            ptr++;
        }
    }
}